

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O1

int ps_alignment_populate_ci(ps_alignment_t *al)

{
  short sVar1;
  uint16 uVar2;
  int iVar3;
  uint uVar4;
  bin_mdef_t *pbVar5;
  dict_t *pdVar6;
  ps_alignment_entry_t *ppVar7;
  char *fmt;
  ps_alignment_entry_t *ppVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  (al->sseq).n_ent = 0;
  (al->state).n_ent = 0;
  pbVar5 = al->d2p->mdef;
  if ((al->word).n_ent != 0) {
    pdVar6 = al->d2p->dict;
    uVar9 = 0;
    do {
      ppVar8 = (al->word).seq;
      iVar3 = ppVar8[uVar9].id.wid;
      lVar10 = (long)pdVar6->word[iVar3].pronlen;
      if (0 < lVar10) {
        ppVar8 = ppVar8 + uVar9;
        lVar11 = 0;
        do {
          ppVar7 = ps_alignment_vector_grow_one(&al->sseq);
          if (ppVar7 == (ps_alignment_entry_t *)0x0) {
            fmt = "Failed to add phone entry!\n";
            lVar10 = 0x111;
            goto LAB_0010f03b;
          }
          sVar1 = pdVar6->word[iVar3].ciphone[lVar11];
          (ppVar7->id).pid.cipid = sVar1;
          (ppVar7->id).pid.tmatid = pbVar5->phone[sVar1].tmat;
          uVar4 = pbVar5->phone[sVar1].ssid;
          (ppVar7->id).pid.ssid = (uint16)uVar4;
          if ((~uVar4 & 0xffff) == 0) {
            __assert_fail("sent->id.pid.ssid != BAD_SSID",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                          ,0x117,"int ps_alignment_populate_ci(ps_alignment_t *)");
          }
          ppVar7->start = ppVar8->start;
          ppVar7->duration = ppVar8->duration;
          ppVar7->score = 0;
          ppVar7->parent = (int)uVar9;
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (al->word).n_ent);
  }
  if ((al->sseq).n_ent != 0) {
    uVar9 = 0;
    do {
      if (0 < pbVar5->n_emit_state) {
        ppVar8 = (al->sseq).seq + uVar9;
        lVar10 = 0;
        do {
          ppVar7 = ps_alignment_vector_grow_one(&al->state);
          if (ppVar7 == (ps_alignment_entry_t *)0x0) {
            fmt = "Failed to add state entry!\n";
            lVar10 = 0x129;
LAB_0010f03b:
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                    ,lVar10,fmt);
            return -1;
          }
          uVar2 = pbVar5->sseq[(ppVar8->id).pid.ssid][lVar10];
          (ppVar7->id).pid.cipid = uVar2;
          if (uVar2 == 0xffff) {
            __assert_fail("sent->id.senid != BAD_SENID",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                          ,0x12d,"int ps_alignment_populate_ci(ps_alignment_t *)");
          }
          ppVar7->start = ppVar8->start;
          ppVar7->duration = ppVar8->duration;
          ppVar7->score = 0;
          ppVar7->parent = (int)uVar9;
          if (lVar10 == 0) {
            ppVar8->child =
                 ((uint)((int)ppVar7 - *(int *)&(al->state).seq) >> 2) * -0x49249249 & 0xffff;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < pbVar5->n_emit_state);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (al->sseq).n_ent);
  }
  return 0;
}

Assistant:

int
ps_alignment_populate_ci(ps_alignment_t *al)
{
    dict2pid_t *d2p;
    dict_t *dict;
    bin_mdef_t *mdef;
    int i;

    /* Clear phone and state sequences. */
    ps_alignment_vector_empty(&al->sseq);
    ps_alignment_vector_empty(&al->state);

    /* For each word, expand to phones/senone sequences. */
    d2p = al->d2p;
    dict = d2p->dict;
    mdef = d2p->mdef;
    for (i = 0; i < al->word.n_ent; ++i) {
        ps_alignment_entry_t *went = al->word.seq + i;
        ps_alignment_entry_t *sent;
        int wid = went->id.wid;
        int len = dict_pronlen(dict, wid);
        int j;

        for (j = 0; j < len; ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_pron(dict, wid, j);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            sent->id.pid.ssid = bin_mdef_pid2ssid(mdef, sent->id.pid.cipid);
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }
    }

    /* For each senone sequence, expand to senones.  (we could do this
     * nested above but this makes it more clear and easier to
     * refactor) */
    for (i = 0; i < al->sseq.n_ent; ++i) {
        ps_alignment_entry_t *pent = al->sseq.seq + i;
        ps_alignment_entry_t *sent;
        int j;

        for (j = 0; j < bin_mdef_n_emit_state(mdef); ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->state)) == NULL) {
                E_ERROR("Failed to add state entry!\n");
                return -1;
            }
            sent->id.senid = bin_mdef_sseq2sen(mdef, pent->id.pid.ssid, j);
            assert(sent->id.senid != BAD_SENID);
            sent->start = pent->start;
            sent->duration = pent->duration;
            sent->score = 0;
            sent->parent = i;
            if (j == 0)
                pent->child = (uint16)(sent - al->state.seq);
        }
    }

    return 0;
}